

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * quoteIfNeeded(string *__return_storage_ptr__,string *input)

{
  long lVar1;
  long lVar2;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_70;
  undefined1 local_50 [8];
  string output;
  size_type op;
  size_type space;
  size_type quote;
  string *input_local;
  
  lVar1 = std::__cxx11::string::find((char)input,0x22);
  lVar2 = std::__cxx11::string::find((char)input,0x20);
  output.field_2._8_8_ = std::__cxx11::string::find_first_of((char *)input,0x1d2a33);
  if (((lVar1 == -1) && (lVar2 == -1)) && (output.field_2._8_8_ == -1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  }
  else {
    std::__cxx11::string::string((string *)local_50);
    if (lVar1 == -1) {
      std::__cxx11::string::operator=((string *)local_50,(string *)input);
    }
    else {
      escape(&local_70,input,0x22);
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"\"",&local_c1);
    std::operator+(&local_a0,&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::operator+(__return_storage_ptr__,&local_a0,"\"");
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string quoteIfNeeded (const std::string& input)
{
  auto quote = input.find ('"');
  auto space = input.find (' ');
  auto op    = input.find_first_of ("-+/()<^!=~_%");

  if (quote == std::string::npos &&
      space == std::string::npos &&
      op    == std::string::npos)
  {
    return input;
  }

  std::string output;
  if (quote != std::string::npos)
  {
    output = escape (input, '"');
  }
  else
  {
    output = input;
  }

  return std::string ("\"") + output + "\"";
}